

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O0

ssize_t __thiscall
hta::storage::file::File<hta::storage::file::Metric::Header,_hta::TimeValue>::read
          (File<hta::storage::file::Metric::Header,_hta::TimeValue> *this,int __fd,void *__buf,
          size_t __nbytes)

{
  streamoff sVar1;
  undefined4 in_register_00000034;
  TimeValue TVar2;
  fpos<__mbstate_t> local_50;
  fpos<__mbstate_t> local_40;
  File<hta::storage::file::Metric::Header,_hta::TimeValue> *local_30;
  File<hta::storage::file::Metric::Header,_hta::TimeValue> *this_local;
  pos_type pos_local;
  
  this_local = (File<hta::storage::file::Metric::Header,_hta::TimeValue> *)
               CONCAT44(in_register_00000034,__fd);
  local_30 = this;
  pos_local._M_off = (streamoff)__buf;
  sVar1 = std::fpos::operator_cast_to_long((fpos *)&this_local);
  std::fpos<__mbstate_t>::fpos(&local_50,sVar1 << 4);
  sVar1 = std::fpos::operator_cast_to_long((fpos *)&local_50);
  local_40 = std::fpos<__mbstate_t>::operator+(&this->data_begin_,sVar1);
  std::istream::seekg(&this->stream_,local_40._M_off,local_40._M_state);
  check_stream(this,"seekg for read");
  TVar2 = read<hta::TimeValue>(this);
  pos_local._M_state =
       (__mbstate_t)
       TVar2.time.
       super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.
       __r;
  return (ssize_t)pos_local._M_state;
}

Assistant:

value_type read(pos_type pos)
    {
        stream_.seekg(data_begin_ + static_cast<pos_type>(pos * value_size));
        check_stream("seekg for read");
        return read<value_type>();
    }